

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O3

EExpr * __thiscall
mp::QP2PassVisitor::GetPass2Result(EExpr *__return_storage_ptr__,QP2PassVisitor *this)

{
  SmallVec<int,_6> *this_00;
  int iVar1;
  size_ty request;
  size_ty sVar2;
  ptr piVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int local_44;
  pair<std::pair<int,_int>,_double> local_40;
  
  this->pass_ = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_
           .super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 8) = 6;
  *(inline_storage<double,_6U> **)
   &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long> =
       &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.coefs_
           .super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
             vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long> + 8
   ) = 8;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             folded_.
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long> +
   0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 8) = 6;
  (__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
             vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  *(size_ty *)
   ((long)&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms.
           vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long> + 0x10) = 0;
  (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = (double)this->const_term_;
  request = (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  gch::detail::small_vector_base<std::allocator<double>,_6U>::request_capacity
            ((small_vector_base<std::allocator<double>,_6U> *)__return_storage_ptr__,request);
  this_00 = &(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.super_LinTerms.
             vars_;
  gch::detail::small_vector_base<std::allocator<int>,_6U>::request_capacity
            (&this_00->super_small_vector_base<std::allocator<int>,_6U>,request);
  sVar2 = (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  if (sVar2 != 0) {
    piVar3 = (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    lVar9 = 0;
    do {
      iVar1 = *(int *)((long)piVar3 + lVar9);
      local_40.first =
           *(pair<int,_int> *)
            ((this->coefs_lin_dense_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + iVar1);
      if (((double)local_40.first != 0.0) || (NAN((double)local_40.first))) {
        local_44 = iVar1;
        gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                  ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,
                   (double *)&local_40);
        gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                  ((small_vector_base<std::allocator<int>,6u> *)this_00,&local_44);
      }
      lVar9 = lVar9 + 4;
    } while (sVar2 << 2 != lVar9);
  }
  uVar4 = (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  if (uVar4 != 0) {
    uVar10 = 0;
    do {
      uVar7 = uVar10;
      if (uVar10 < uVar4) {
        do {
          uVar6 = (uint)uVar7;
          uVar8 = (uint)uVar10;
          uVar5 = uVar8;
          if (uVar6 < uVar8) {
            uVar5 = uVar6;
          }
          if (uVar8 < uVar6) {
            uVar8 = uVar6;
          }
          local_40.second =
               (this->coefs_qp_).matrix.super_small_vector_base<std::allocator<double>,_136U>.m_data
               .super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr
               [((uVar8 + 1) * uVar8 >> 1) + uVar5];
          if ((local_40.second != 0.0) || (NAN(local_40.second))) {
            piVar3 = (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
                     super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
            local_40.first.second = piVar3[uVar7];
            local_40.first.first = piVar3[uVar10];
            gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u>
            ::append_element<std::pair<std::pair<int,int>,double>const&>
                      ((small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u> *
                       )&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.
                         super_QuadTerms,&local_40);
            uVar4 = (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_size;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar4);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr QP2PassVisitor::GetPass2Result() {
  assert(2==pass_);
  pass_ = 0;          // to indicate the run is finished
  EExpr result;
  result.constant_term(const_term_);
  result.GetLinTerms().reserve(vars_lin_.size());
  for (auto vl: vars_lin_)
    if (auto c = coefs_lin_dense_[vl])
      result.GetLinTerms().add_term(c, vl);
  assert(result.GetLinTerms().is_sorted());
  for (std::size_t i=0; i<vars_qp_.size(); ++i)
    for (std::size_t j=i; j<vars_qp_.size(); ++j)
      if (auto c = coefs_qp_(i, j))
        result.GetQPTerms().add_term(
            c, vars_qp_[i], vars_qp_[j]);
  assert(result.GetQPTerms().is_sorted());
  return result;
}